

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int cbs_get_asn1(CBS *cbs,CBS *out,CBS_ASN1_TAG tag_value,int skip_header)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  CBS *pCVar4;
  CBS *out_00;
  CBS_ASN1_TAG tag;
  size_t header_len;
  CBS throwaway;
  CBS_ASN1_TAG local_4c;
  ulong local_48;
  CBS local_40;
  
  out_00 = out;
  if (out == (CBS *)0x0) {
    out_00 = &local_40;
  }
  iVar2 = cbs_get_any_asn1_element(cbs,out_00,&local_4c,&local_48,(int *)0x0,(int *)0x0,0);
  iVar3 = 0;
  if (((iVar2 != 0) && (iVar3 = 0, local_4c == tag_value)) && (iVar3 = 1, skip_header != 0)) {
    pCVar4 = &local_40;
    if (out != (CBS *)0x0) {
      pCVar4 = out;
    }
    uVar1 = pCVar4->len;
    if (uVar1 < local_48) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x1c5,"int cbs_get_asn1(CBS *, CBS *, CBS_ASN1_TAG, int)");
    }
    out_00->data = out_00->data + local_48;
    pCVar4->len = uVar1 - local_48;
  }
  return iVar3;
}

Assistant:

static int cbs_get_asn1(CBS *cbs, CBS *out, CBS_ASN1_TAG tag_value,
                        int skip_header) {
  size_t header_len;
  CBS_ASN1_TAG tag;
  CBS throwaway;

  if (out == NULL) {
    out = &throwaway;
  }

  if (!CBS_get_any_asn1_element(cbs, out, &tag, &header_len) ||
      tag != tag_value) {
    return 0;
  }

  if (skip_header && !CBS_skip(out, header_len)) {
    assert(0);
    return 0;
  }

  return 1;
}